

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O0

void __thiscall tvm::runtime::WorkspacePool::Pool::Free(Pool *this,void *data)

{
  void *pvVar1;
  reference pvVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  size_type sVar5;
  size_type sVar6;
  reference pvVar7;
  bool bVar8;
  size_type local_1f8;
  size_t i;
  __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
  local_1e8;
  __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
  local_1e0;
  const_iterator local_1d8;
  LogMessageFatal local_1c0;
  LogCheckError local_38;
  LogCheckError _check_err;
  undefined1 auStack_28 [4];
  int index;
  Entry e;
  void *data_local;
  Pool *this_local;
  
  e.size = (size_t)data;
  pvVar2 = std::
           vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
           ::back(&this->allocated_);
  if (pvVar2->data == (void *)e.size) {
    pvVar2 = std::
             vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ::back(&this->allocated_);
    _auStack_28 = pvVar2->data;
    e.data = (void *)pvVar2->size;
    std::
    vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
    ::pop_back(&this->allocated_);
  }
  else {
    sVar5 = std::
            vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
            ::size(&this->allocated_);
    _check_err.str._4_4_ = (int)sVar5 + -2;
    while( true ) {
      bVar8 = false;
      if (0 < _check_err.str._4_4_) {
        pvVar2 = std::
                 vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                 ::operator[](&this->allocated_,(long)_check_err.str._4_4_);
        bVar8 = pvVar2->data != (void *)e.size;
      }
      if (!bVar8) break;
      _check_err.str._4_4_ = _check_err.str._4_4_ + -1;
    }
    dmlc::LogCheck_GT((dmlc *)&local_38,_check_err.str._4_4_,0);
    bVar8 = dmlc::LogCheckError::operator_cast_to_bool(&local_38);
    if (bVar8) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/workspace_pool.cc"
                 ,99);
      poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1c0);
      poVar4 = std::operator<<((ostream *)poVar3,"Check failed: ");
      poVar4 = std::operator<<(poVar4,"index > 0");
      poVar4 = std::operator<<(poVar4,(string *)local_38.str);
      poVar4 = std::operator<<(poVar4,": ");
      std::operator<<(poVar4,"trying to free things that has not been allocated");
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1c0);
    }
    dmlc::LogCheckError::~LogCheckError(&local_38);
    pvVar2 = std::
             vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ::operator[](&this->allocated_,(long)_check_err.str._4_4_);
    _auStack_28 = pvVar2->data;
    e.data = (void *)pvVar2->size;
    local_1e8._M_current =
         (Entry *)std::
                  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                  ::begin(&this->allocated_);
    local_1e0 = __gnu_cxx::
                __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
                ::operator+(&local_1e8,(long)_check_err.str._4_4_);
    __gnu_cxx::
    __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_const*,std::vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>>
    ::__normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry*>
              ((__normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_const*,std::vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>>
                *)&local_1d8,&local_1e0);
    std::
    vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
    ::erase(&this->allocated_,local_1d8);
  }
  pvVar2 = std::
           vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
           ::back(&this->free_list_);
  if ((void *)pvVar2->size < e.data) {
    std::
    vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
    ::push_back(&this->free_list_,(value_type *)auStack_28);
  }
  else {
    sVar5 = std::
            vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
            ::size(&this->free_list_);
    if (sVar5 == 2) {
      pvVar2 = std::
               vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ::back(&this->free_list_);
      std::
      vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ::push_back(&this->free_list_,pvVar2);
      pvVar2 = std::
               vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ::operator[](&this->free_list_,1);
      pvVar2->data = _auStack_28;
      pvVar2->size = (size_t)e.data;
    }
    else {
      sVar5 = std::
              vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
              ::size(&this->free_list_);
      sVar6 = std::
              vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
              ::size(&this->free_list_);
      std::
      vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ::resize(&this->free_list_,sVar6 + 1);
      while( true ) {
        pvVar1 = e.data;
        local_1f8 = sVar5 - 1;
        pvVar2 = std::
                 vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                 ::operator[](&this->free_list_,local_1f8);
        if ((void *)pvVar2->size <= pvVar1) break;
        pvVar2 = std::
                 vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                 ::operator[](&this->free_list_,local_1f8);
        pvVar7 = std::
                 vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                 ::operator[](&this->free_list_,sVar5);
        pvVar7->data = pvVar2->data;
        pvVar7->size = pvVar2->size;
        sVar5 = local_1f8;
      }
      pvVar2 = std::
               vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ::operator[](&this->free_list_,sVar5);
      pvVar2->data = _auStack_28;
      pvVar2->size = (size_t)e.data;
    }
  }
  return;
}

Assistant:

void Free(void *data) {
    Entry e;
    if (allocated_.back().data == data) {
      // quick path, last allocated.
      e = allocated_.back();
      allocated_.pop_back();
    } else {
      int index = static_cast<int>(allocated_.size()) - 2;
      for (; index > 0 && allocated_[index].data != data; --index) {
      }
      CHECK_GT(index, 0) << "trying to free things that has not been allocated";
      e = allocated_[index];
      allocated_.erase(allocated_.begin() + index);
    }
    if (free_list_.back().size < e.size) {
      free_list_.push_back(e);
    } else if (free_list_.size() == 2) {
      free_list_.push_back(free_list_.back());
      free_list_[1] = e;
    } else {
      size_t i = free_list_.size() - 1;
      free_list_.resize(free_list_.size() + 1);
      for (; e.size < free_list_[i].size; --i) {
        free_list_[i + 1] = free_list_[i];
      }
      free_list_[i + 1] = e;
    }
  }